

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O1

void __thiscall
glslang::TResolverUniformAdaptor::operator()
          (TResolverUniformAdaptor *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          *entKey)

{
  TVarEntryInfo *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  iterator iVar3;
  undefined4 extraout_var_00;
  uint32_t idx;
  ulong uVar4;
  TString err;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_40;
  
  pTVar1 = &entKey->second;
  (entKey->second).upgradedToPushConstantPacking = ElpNone;
  (entKey->second).newBinding = -1;
  (entKey->second).newSet = -1;
  (entKey->second).newLocation = -1;
  (entKey->second).newComponent = -1;
  (entKey->second).newIndex = -1;
  iVar2 = (*this->resolver->_vptr_TIoMapResolver[2])(this->resolver,(ulong)this->stage,pTVar1);
  if ((char)iVar2 == '\0') {
    std::operator+(&local_40,"Invalid binding: ",&entKey->first);
    TInfoSinkBase::message(&this->infoSink->info,EPrefixInternalError,local_40._M_dataplus._M_p);
    *this->error = true;
  }
  else {
    (*this->resolver->_vptr_TIoMapResolver[4])(this->resolver,(ulong)(entKey->second).stage,pTVar1);
    (*this->resolver->_vptr_TIoMapResolver[3])(this->resolver,(ulong)(entKey->second).stage,pTVar1);
    (*this->resolver->_vptr_TIoMapResolver[5])(this->resolver,(ulong)(entKey->second).stage,pTVar1);
    iVar2 = (entKey->second).newBinding;
    if (iVar2 != -1) {
      if (0xfffe < iVar2) {
        std::operator+(&local_40,"mapped binding out of range: ",&entKey->first);
        TInfoSinkBase::message(&this->infoSink->info,EPrefixInternalError,local_40._M_dataplus._M_p)
        ;
        *this->error = true;
      }
      iVar2 = (*(((entKey->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                [0x21])();
      if ((short)((ulong)*(undefined8 *)(CONCAT44(extraout_var,iVar2) + 0x1c) >> 0x20) != -1) {
        uVar4 = 0;
        do {
          if (((uVar4 != (entKey->second).stage) &&
              (&this->uniformVarMap[uVar4]->_M_t !=
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                *)0x0)) &&
             (iVar3 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                      ::find(&this->uniformVarMap[uVar4]->_M_t,&entKey->first),
             (_Rb_tree_header *)iVar3._M_node !=
             &(this->uniformVarMap[uVar4]->_M_t)._M_impl.super__Rb_tree_header)) {
            iVar3._M_node[3]._M_color = (entKey->second).newBinding;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 0xe);
      }
    }
    iVar2 = (entKey->second).newSet;
    if (iVar2 != -1) {
      if (0x3e < iVar2) {
        std::operator+(&local_40,"mapped set out of range: ",&entKey->first);
        TInfoSinkBase::message(&this->infoSink->info,EPrefixInternalError,local_40._M_dataplus._M_p)
        ;
        *this->error = true;
      }
      iVar2 = (*(((entKey->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                [0x21])();
      if ((*(uint *)(CONCAT44(extraout_var_00,iVar2) + 0x1c) & 0x3f8000) != 0x1f8000) {
        uVar4 = 0;
        do {
          if (((uVar4 != this->stage) &&
              (&this->uniformVarMap[uVar4]->_M_t !=
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                *)0x0)) &&
             (iVar3 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                      ::find(&this->uniformVarMap[uVar4]->_M_t,&entKey->first),
             (_Rb_tree_header *)iVar3._M_node !=
             &(this->uniformVarMap[uVar4]->_M_t)._M_impl.super__Rb_tree_header)) {
            *(int *)&iVar3._M_node[3].field_0x4 = (entKey->second).newSet;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 0xe);
      }
    }
  }
  return;
}

Assistant:

inline void operator()(std::pair<const TString, TVarEntryInfo>& entKey) {
        TVarEntryInfo& ent = entKey.second;
        ent.clearNewAssignments();
        const bool isValid = resolver.validateBinding(stage, ent);
        if (isValid) {
            resolver.resolveSet(ent.stage, ent);
            resolver.resolveBinding(ent.stage, ent);
            resolver.resolveUniformLocation(ent.stage, ent);

            if (ent.newBinding != -1) {
                if (ent.newBinding >= int(TQualifier::layoutBindingEnd)) {
                    TString err = "mapped binding out of range: " + entKey.first;

                    infoSink.info.message(EPrefixInternalError, err.c_str());
                    error = true;
                }

                if (ent.symbol->getQualifier().hasBinding()) {
                    for (uint32_t idx = EShLangVertex; idx < EShLangCount; ++idx) {
                        if (idx == ent.stage || uniformVarMap[idx] == nullptr)
                            continue;
                        auto entKey2 = uniformVarMap[idx]->find(entKey.first);
                        if (entKey2 != uniformVarMap[idx]->end()) {
                            entKey2->second.newBinding = ent.newBinding;
                        }
                    }
                }
            }
            if (ent.newSet != -1) {
                if (ent.newSet >= int(TQualifier::layoutSetEnd)) {
                    TString err = "mapped set out of range: " + entKey.first;

                    infoSink.info.message(EPrefixInternalError, err.c_str());
                    error = true;
                }
                if (ent.symbol->getQualifier().hasSet()) {
                    for (uint32_t idx = EShLangVertex; idx < EShLangCount; ++idx) {
                        if ((idx == stage) || (uniformVarMap[idx] == nullptr))
                            continue;
                        auto entKey2 = uniformVarMap[idx]->find(entKey.first);
                        if (entKey2 != uniformVarMap[idx]->end()) {
                            entKey2->second.newSet = ent.newSet;
                        }
                    }
                }
            }
        } else {
            TString errorMsg = "Invalid binding: " + entKey.first;
            infoSink.info.message(EPrefixInternalError, errorMsg.c_str());
            error = true;
        }
    }